

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int authorize(mg_connection *conn,mg_file *filep,char *realm)

{
  int iVar1;
  char *pcVar2;
  char local_22c8 [8];
  char buf [8192];
  undefined1 local_2c0 [8];
  read_auth_file_struct workdata;
  char *realm_local;
  mg_file *filep_local;
  mg_connection *conn_local;
  
  if ((conn == (mg_connection *)0x0) || (conn->dom_ctx == (mg_domain_context *)0x0)) {
    conn_local._4_4_ = 0;
  }
  else {
    workdata.f_ha1 = realm;
    memset(local_2c0,0,0x298);
    local_2c0 = (undefined1  [8])conn;
    iVar1 = parse_auth_header(conn,local_22c8,0x2000,(ah *)&workdata);
    if (iVar1 == 0) {
      conn_local._4_4_ = 0;
    }
    else {
      pcVar2 = mg_strdup_ctx((char *)workdata.conn,conn->phys_ctx);
      (conn->request_info).remote_user = pcVar2;
      if (workdata.f_ha1 == (char *)0x0) {
        workdata.ah.nonce = conn->dom_ctx->config[0x1e];
      }
      else {
        workdata.ah.nonce = workdata.f_ha1;
      }
      conn_local._4_4_ = read_auth_file(filep,(read_auth_file_struct *)local_2c0,9);
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
authorize(struct mg_connection *conn, struct mg_file *filep, const char *realm)
{
	struct read_auth_file_struct workdata;
	char buf[MG_BUF_LEN];

	if (!conn || !conn->dom_ctx) {
		return 0;
	}

	memset(&workdata, 0, sizeof(workdata));
	workdata.conn = conn;

	if (!parse_auth_header(conn, buf, sizeof(buf), &workdata.ah)) {
		return 0;
	}

	/* CGI needs it as REMOTE_USER */
	conn->request_info.remote_user =
	    mg_strdup_ctx(workdata.ah.user, conn->phys_ctx);

	if (realm) {
		workdata.domain = realm;
	} else {
		workdata.domain = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
	}

	return read_auth_file(filep, &workdata, INITIAL_DEPTH);
}